

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

scalar __thiscall
absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>(absl *this,S2Polygon **args)

{
  S2Polygon *polygon;
  S2PolygonLayer *this_00;
  Options local_20;
  S2Polygon **local_18;
  S2Polygon **args_local;
  
  local_18 = args;
  args_local = (S2Polygon **)this;
  this_00 = (S2PolygonLayer *)operator_new(0x28);
  polygon = *local_18;
  s2builderutil::S2PolygonLayer::Options::Options(&local_20);
  s2builderutil::S2PolygonLayer::S2PolygonLayer(this_00,polygon,&local_20);
  std::unique_ptr<s2builderutil::S2PolygonLayer,std::default_delete<s2builderutil::S2PolygonLayer>>
  ::unique_ptr<std::default_delete<s2builderutil::S2PolygonLayer>,void>
            ((unique_ptr<s2builderutil::S2PolygonLayer,std::default_delete<s2builderutil::S2PolygonLayer>>
              *)this,this_00);
  return (__uniq_ptr_data<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}